

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2::normalizeUTF8
          (Normalizer2 *this,uint32_t param_1,StringPiece src,ByteSink *sink,Edits *edits,
          UErrorCode *errorCode)

{
  UBool UVar1;
  undefined8 uVar2;
  StringPiece utf8;
  UnicodeString local_c8;
  UnicodeString *local_88;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  UnicodeString src16;
  Edits *edits_local;
  ByteSink *sink_local;
  uint32_t param_1_local;
  Normalizer2 *this_local;
  StringPiece src_local;
  
  uVar2 = src._8_8_;
  src16.fUnion._48_8_ = edits;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (src16.fUnion._48_8_ == 0) {
      uStack_80 = CONCAT44(src_local.ptr_._4_4_,src.length_);
      utf8._8_8_ = uVar2;
      utf8.ptr_ = (char *)(ulong)(uint)src.length_;
      local_88 = (UnicodeString *)src.ptr_;
      UnicodeString::fromUTF8((UnicodeString *)local_78,(UnicodeString *)src.ptr_,utf8);
      normalize(&local_c8,this,(UnicodeString *)local_78,errorCode);
      UnicodeString::toUTF8(&local_c8,sink);
      UnicodeString::~UnicodeString(&local_c8);
      UnicodeString::~UnicodeString((UnicodeString *)local_78);
    }
    else {
      *errorCode = U_UNSUPPORTED_ERROR;
    }
  }
  return;
}

Assistant:

void
Normalizer2::normalizeUTF8(uint32_t /*options*/, StringPiece src, ByteSink &sink,
                           Edits *edits, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return;
    }
    if (edits != nullptr) {
        errorCode = U_UNSUPPORTED_ERROR;
        return;
    }
    UnicodeString src16 = UnicodeString::fromUTF8(src);
    normalize(src16, errorCode).toUTF8(sink);
}